

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

int __thiscall minihttp::TcpSocket::close(TcpSocket *this,int __fd)

{
  int in_EAX;
  
  if (this->_s != -1) {
    (*this->_vptr_TcpSocket[3])();
    in_EAX = ::close((int)this->_s);
    this->_s = -1;
    this->_recvSize = 0;
  }
  return in_EAX;
}

Assistant:

void TcpSocket::close(void)
{
    if(!SOCKETVALID(_s))
        return;

    traceprint("TcpSocket::close\n");

    _OnCloseInternal();

#ifdef MINIHTTP_USE_MBEDTLS
    if(_sslctx)
        ((SSLCtx*)_sslctx)->reset();
    mbedtls_net_free((mbedtls_net_context*)&_s);
    shutdownSSL();
#else
#  ifdef _WIN32
    ::closesocket((SOCKET)_s);
#  else
    ::close(_s);
#  endif
#endif

    _s = INVALID_SOCKET;
    _recvSize = 0;
}